

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

ostream * operator<<(ostream *strm,Company *obj)

{
  int iVar1;
  ostream *poVar2;
  int local_1c;
  int i;
  Company *obj_local;
  ostream *strm_local;
  
  Company::arrange(obj);
  poVar2 = operator<<((ostream *)&std::cout,obj->boss);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(obj->boss);
    if (iVar1 <= local_1c) break;
    poVar2 = operator<<(strm,obj->employees[local_1c]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  std::operator<<((ostream *)&std::cout,"budget: ");
  std::ostream::operator<<(strm,obj->budget);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, Company &obj) {
    obj.arrange();
    cout << *obj.boss << endl;
    for (int i = 0; i < obj.boss->getNumberOfEmployees(); ++i) {
        strm << *obj.employees[i] << endl;
    }
    cout << "budget: ";
    strm << obj.budget;
    return strm;
}